

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O2

void stbtt__dict_get_ints(stbtt__buf *b,int key,int outcount,stbtt_uint32 *out)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  stbtt_uint32 sVar4;
  uchar *puVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint o;
  stbtt__buf operands;
  stbtt__buf local_40;
  
  uVar3 = b->size;
  o = (int)uVar3 >> 0x1f & uVar3;
  b->cursor = o;
  do {
    uVar1 = o;
    if ((int)uVar3 <= (int)o) {
      if ((int)uVar3 < 0) {
        puVar5 = (uchar *)0x0;
      }
      else {
        puVar5 = b->data;
      }
      local_40.cursor = 0;
      local_40.size = 0;
      local_40.data = puVar5;
LAB_0017e63e:
      uVar8 = local_40._8_8_;
      uVar6 = uVar8 >> 0x20;
      lVar9 = 0;
      while ((lVar9 < outcount && ((int)uVar8 < (int)uVar6))) {
        sVar4 = stbtt__cff_int(&local_40);
        out[lVar9] = sVar4;
        lVar9 = lVar9 + 1;
        uVar6 = (ulong)(uint)local_40.size;
        uVar8 = (ulong)(uint)local_40.cursor;
      }
      return;
    }
    while (((int)uVar1 < (int)uVar3 && (0x1b < b->data[(int)uVar1]))) {
      if (b->data[(int)uVar1] == 0x1e) {
        uVar7 = uVar1 + 1;
        if ((int)uVar1 < -1) {
          uVar7 = uVar3;
        }
        b->cursor = uVar7;
        do {
          if ((b->size <= b->cursor) || (bVar2 = stbtt__buf_get8(b), (~bVar2 & 0xf) == 0)) break;
        } while ((bVar2 & 0xf0) != 0xf0);
      }
      else {
        stbtt__cff_int(b);
      }
      uVar3 = b->size;
      uVar1 = b->cursor;
    }
    bVar2 = stbtt__buf_get8(b);
    if (bVar2 == 0xc) {
      bVar2 = stbtt__buf_get8(b);
      uVar3 = bVar2 | 0x100;
    }
    else {
      uVar3 = (uint)bVar2;
    }
    if (uVar3 == key) {
      local_40 = stbtt__buf_range(b,o,uVar1 - o);
      goto LAB_0017e63e;
    }
    o = b->cursor;
    uVar3 = b->size;
  } while( true );
}

Assistant:

static void stbtt__dict_get_ints(stbtt__buf *b, int key, int outcount, stbtt_uint32 *out)
{
   int i;
   stbtt__buf operands = stbtt__dict_get(b, key);
   for (i = 0; i < outcount && operands.cursor < operands.size; i++)
      out[i] = stbtt__cff_int(&operands);
}